

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetStyle::setProperties(QStyleSheetStyle *this,QWidget *w)

{
  long lVar1;
  QStringView s;
  QStringView s_00;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  qsizetype qVar6;
  ulong uVar7;
  QDuplicateTracker<QString,_32UL> *this_00;
  char *pcVar8;
  QRect *pQVar9;
  QSize *pQVar10;
  const_reference pVVar11;
  QDuplicateTracker<QString,_32UL> *in_RSI;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  int index;
  QMetaObject *metaObject;
  Declaration *decl;
  int i_1;
  int i;
  QMetaProperty metaProperty;
  QByteArray propertyL1;
  QStringView property_1;
  QString property;
  QList<int> finals;
  QList<QCss::Declaration> decls;
  QVariant value;
  QVariant v;
  QDuplicateTracker<QString,_32UL> propertySet;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff538;
  undefined4 in_stack_fffffffffffff540;
  uint in_stack_fffffffffffff544;
  uint uVar13;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff548;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff550;
  QPalette *in_stack_fffffffffffff558;
  QDuplicateTracker<QString,_32UL> *in_stack_fffffffffffff560;
  anon_union_24_3_e3d07ef4_for_data *in_stack_fffffffffffff568;
  undefined4 in_stack_fffffffffffff570;
  undefined4 in_stack_fffffffffffff574;
  QString *in_stack_fffffffffffff578;
  undefined4 in_stack_fffffffffffff580;
  undefined4 in_stack_fffffffffffff584;
  undefined4 in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff58c;
  int local_a50;
  QLatin1StringView in_stack_fffffffffffff5b8;
  int local_a34;
  undefined1 local_a00 [24];
  QKeySequence local_9e8 [8];
  QStyleSheetStyle *in_stack_fffffffffffff620;
  undefined4 local_9d0;
  undefined2 uStack_9cc;
  uint local_9c4;
  undefined1 local_9c0 [24];
  QPixmap local_9a8 [24];
  undefined1 local_990 [24];
  QImage local_978 [24];
  QIcon local_960;
  qsizetype local_958;
  storage_type_conflict *local_950;
  QDebug local_928;
  QDebug local_920;
  undefined1 *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  undefined1 *local_900;
  qsizetype local_8f8;
  storage_type_conflict *local_8f0;
  QDebug local_8c8;
  QDebug local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  QStringView local_8a0;
  undefined1 *local_890;
  storage_type_conflict *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  QList<int> local_868 [3];
  QList<QCss::Declaration> local_820;
  QPalette local_808;
  QPalette local_7f8;
  undefined8 local_7e8;
  undefined4 local_7e0;
  undefined2 local_7dc;
  QVariant local_7d8;
  QVariant local_7b8;
  QVariant local_798;
  QVariant local_778;
  QVariant local_758;
  QVariant local_738;
  QVariant local_718;
  QVariant local_6f8;
  anon_union_24_3_e3d07ef4_for_data local_6d8;
  undefined1 *puStack_6c0;
  anon_union_24_3_e3d07ef4_for_data local_6b8;
  undefined1 *puStack_6a0;
  undefined1 local_690 [376];
  QObject *in_stack_fffffffffffffae8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_820.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_820.d.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  local_820.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  styleRules(in_stack_fffffffffffff620,in_stack_fffffffffffffae8);
  QString::QString((QString *)0x429aa3);
  declarations((QList<QCss::StyleRule> *)
               CONCAT44(in_stack_fffffffffffff584,in_stack_fffffffffffff580),
               in_stack_fffffffffffff578,
               CONCAT44(in_stack_fffffffffffff574,in_stack_fffffffffffff570));
  QString::~QString((QString *)0x429ad2);
  QList<QCss::StyleRule>::~QList((QList<QCss::StyleRule> *)0x429adf);
  local_868[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_868[0].d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_868[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x429b19);
  memcpy(local_690,&DAT_00aafa50,0x688);
  QList<QCss::Declaration>::size(&local_820);
  QDuplicateTracker<QString,_32UL>::QDuplicateTracker
            (in_stack_fffffffffffff560,(qsizetype)in_stack_fffffffffffff558);
  qVar6 = QList<QCss::Declaration>::size(&local_820);
  local_a34 = (int)qVar6;
  while (local_a34 = local_a34 + -1, -1 < local_a34) {
    local_880 = &DAT_aaaaaaaaaaaaaaaa;
    local_878 = &DAT_aaaaaaaaaaaaaaaa;
    local_870 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QCss::Declaration>::at
              ((QList<QCss::Declaration> *)
               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (qsizetype)in_stack_fffffffffffff538);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x429bbf);
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                     (QString *)in_stack_fffffffffffff538);
    in_stack_fffffffffffff5b8 =
         Qt::Literals::StringLiterals::operator____L1
                   (in_stack_fffffffffffff548->buffer,
                    CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    uVar7 = QString::startsWith((QLatin1String *)&local_880,
                                (CaseSensitivity)in_stack_fffffffffffff5b8.m_size);
    if (((uVar7 & 1) != 0) &&
       (bVar2 = QDuplicateTracker<QString,_32UL>::hasSeen
                          (in_stack_fffffffffffff548,
                           (QString *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540))
       , !bVar2)) {
      QList<int>::append((QList<int> *)0x429c4e,
                         (parameter_type)((ulong)in_stack_fffffffffffff538 >> 0x20));
    }
    QString::~QString((QString *)0x429c63);
  }
  QDuplicateTracker<QString,_32UL>::~QDuplicateTracker
            ((QDuplicateTracker<QString,_32UL> *)
             CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  qVar6 = QList<int>::size(local_868);
  local_a50 = (int)qVar6;
  while (local_a50 = local_a50 + -1, -1 < local_a50) {
    QList<int>::operator[]
              ((QList<int> *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               (qsizetype)in_stack_fffffffffffff538);
    this_00 = (QDuplicateTracker<QString,_32UL> *)
              QList<QCss::Declaration>::at
                        ((QList<QCss::Declaration> *)
                         CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                         (qsizetype)in_stack_fffffffffffff538);
    local_890 = &DAT_aaaaaaaaaaaaaaaa;
    local_888 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x429d12);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffff550,(QString *)in_stack_fffffffffffff548);
    local_8a0 = QStringView::mid((QStringView *)in_stack_fffffffffffff558,
                                 (qsizetype)in_stack_fffffffffffff568,
                                 (qsizetype)in_stack_fffffffffffff560);
    local_890 = (undefined1 *)local_8a0.m_size;
    local_888 = local_8a0.m_data;
    local_8b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_8b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_8a8 = &DAT_aaaaaaaaaaaaaaaa;
    QStringView::toLatin1
              ((QStringView *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    pcVar8 = (char *)(**(code **)&((DataPointer *)in_RSI->buffer)->d->super_QArrayData)();
    QByteArray::operator_cast_to_char_((QByteArray *)0x429dda);
    iVar5 = QMetaObject::indexOfProperty(pcVar8);
    if (iVar5 == -1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffff550,in_stack_fffffffffffff548->buffer,
                 in_stack_fffffffffffff544,in_stack_fffffffffffff538->buffer);
      QMessageLogger::warning();
      ::operator<<((QDebug *)in_stack_fffffffffffff5b8.m_data,
                   (QWidget *)in_stack_fffffffffffff5b8.m_size);
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff558,
                         (char *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
      local_8f8 = (qsizetype)local_890;
      local_8f0 = local_888;
      s.m_data = (storage_type_conflict *)in_stack_fffffffffffff568;
      s.m_size = (qsizetype)in_stack_fffffffffffff560;
      QDebug::operator<<((QDebug *)in_stack_fffffffffffff558,s);
      QDebug::~QDebug(&local_8c0);
      QDebug::~QDebug(&local_8c8);
    }
    else {
      local_918 = &DAT_aaaaaaaaaaaaaaaa;
      local_910 = &DAT_aaaaaaaaaaaaaaaa;
      local_908 = &DAT_aaaaaaaaaaaaaaaa;
      local_900 = &DAT_aaaaaaaaaaaaaaaa;
      QMetaObject::property((int)&local_918);
      bVar3 = QMetaProperty::isWritable();
      bVar4 = 1;
      if ((bVar3 & 1) != 0) {
        bVar4 = QMetaProperty::isDesignable();
        bVar4 = bVar4 ^ 0xff;
      }
      if ((bVar4 & 1) == 0) {
        local_6b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_6a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_6b8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_6b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        ::QVariant::QVariant((QVariant *)0x42a033);
        local_6d8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_6c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_6d8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        local_6d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        in_stack_fffffffffffff560 = in_RSI;
        QByteArray::operator_cast_to_char_((QByteArray *)0x42a06b);
        in_stack_fffffffffffff568 = &local_6d8;
        QObject::property((char *)in_stack_fffffffffffff568->data);
        iVar5 = ::QVariant::userType((QVariant *)0x42a08f);
        if (iVar5 == 0x13) {
          pQVar9 = (QRect *)QCss::Declaration::rectValue();
          in_stack_fffffffffffff58c = SUB84(pQVar9,0);
          ::QVariant::QVariant(&local_758,pQVar9);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_758);
        }
        else if (iVar5 == 0x15) {
          pQVar10 = (QSize *)QCss::Declaration::sizeValue();
          in_stack_fffffffffffff588 = (undefined4)((ulong)pQVar10 >> 0x20);
          ::QVariant::QVariant(&local_778,pQVar10);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_778);
        }
        else if (iVar5 == 0x1001) {
          QCss::Declaration::uriValue();
          QFlags<Qt::ImageConversionFlag>::QFlags
                    ((QFlags<Qt::ImageConversionFlag> *)
                     CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                     (ImageConversionFlag)((ulong)in_stack_fffffffffffff538 >> 0x20));
          QPixmap::QPixmap(local_9a8,(QString *)local_9c0,(char *)0x0,
                           (QFlags_conflict1 *)(ulong)local_9c4);
          QPixmap::operator_cast_to_QVariant((QPixmap *)&local_738);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_738);
          QPixmap::~QPixmap(local_9a8);
          QString::~QString((QString *)0x42a27e);
        }
        else if (iVar5 == 0x1002) {
          QPalette::QPalette(&local_808);
          QCss::Declaration::brushValue((QPalette *)&stack0xfffffffffffff620);
          QBrush::operator_cast_to_QVariant((QBrush *)&local_7b8);
          ::QVariant::operator=
                    ((QVariant *)this_00,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_7b8);
          QBrush::~QBrush((QBrush *)&stack0xfffffffffffff620);
          QPalette::~QPalette(&local_808);
          in_stack_fffffffffffff548 = this_00;
        }
        else if (iVar5 == 0x1003) {
          in_stack_fffffffffffff558 = &local_7f8;
          QPalette::QPalette(in_stack_fffffffffffff558);
          auVar12 = QCss::Declaration::colorValue((QPalette *)this_00);
          local_7e8 = auVar12._0_8_;
          local_9d0 = auVar12._8_4_;
          local_7e0 = local_9d0;
          uStack_9cc = auVar12._12_2_;
          local_7dc = uStack_9cc;
          QColor::operator_cast_to_QVariant((QColor *)&local_798);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_798);
          QPalette::~QPalette(&local_7f8);
          in_stack_fffffffffffff550 = this_00;
        }
        else if (iVar5 == 0x1005) {
          QCss::Declaration::iconValue();
          QIcon::operator_cast_to_QVariant((QIcon *)&local_6f8);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_6f8);
          QIcon::~QIcon(&local_960);
        }
        else if (iVar5 == 0x1006) {
          QCss::Declaration::uriValue();
          QImage::QImage(local_978,(QString *)local_990,(char *)0x0);
          QImage::operator_cast_to_QVariant((QImage *)&local_718);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_718);
          QImage::~QImage(local_978);
          QString::~QString((QString *)0x42a1e7);
        }
        else if (iVar5 == 0x100b) {
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x42a460);
          QList<QCss::Value>::at
                    ((QList<QCss::Value> *)
                     CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                     (qsizetype)in_stack_fffffffffffff538);
          ::QVariant::toString();
          QKeySequence::QKeySequence(local_9e8,(QString *)local_a00,NativeText);
          QKeySequence::operator_cast_to_QVariant((QKeySequence *)&local_7d8);
          ::QVariant::operator=
                    ((QVariant *)in_stack_fffffffffffff548,
                     (QVariant *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
          ::QVariant::~QVariant(&local_7d8);
          QKeySequence::~QKeySequence(local_9e8);
          QString::~QString((QString *)0x42a4ec);
        }
        else {
          QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                    ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0x42a4f8);
          pVVar11 = QList<QCss::Value>::at
                              ((QList<QCss::Value> *)
                               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                               (qsizetype)in_stack_fffffffffffff538);
          ::QVariant::operator=((QVariant *)&local_6b8,(QVariant *)&pVVar11->variant);
        }
        QByteArrayView::QByteArrayView<QByteArray,_true>
                  ((QByteArrayView *)in_stack_fffffffffffff550,
                   (QByteArray *)in_stack_fffffffffffff548);
        QByteArrayView::QByteArrayView<11ul>
                  ((QByteArrayView *)in_stack_fffffffffffff550,in_stack_fffffffffffff548->buffer);
        bVar2 = ::operator==((QByteArrayView *)
                             CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                             (QByteArrayView *)in_stack_fffffffffffff538);
        uVar13 = in_stack_fffffffffffff544 & 0xffffff;
        if (bVar2) {
          bVar2 = ::operator==((QVariant *)
                               (CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540) &
                               0xffffffffffffff),(QVariant *)in_stack_fffffffffffff538);
          uVar13 = CONCAT13(bVar2,(int3)uVar13);
        }
        in_stack_fffffffffffff544 = uVar13;
        if ((char)(in_stack_fffffffffffff544 >> 0x18) == '\0') {
          in_stack_fffffffffffff538 = in_RSI;
          QByteArray::operator_cast_to_char_((QByteArray *)0x42a5af);
          QObject::setProperty
                    ((QObject *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                     in_stack_fffffffffffff538->buffer,(QVariant *)0x42a5c3);
        }
        ::QVariant::~QVariant((QVariant *)&local_6d8);
        ::QVariant::~QVariant((QVariant *)&local_6b8);
      }
      else {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffff550,in_stack_fffffffffffff548->buffer,
                   in_stack_fffffffffffff544,in_stack_fffffffffffff538->buffer);
        QMessageLogger::warning();
        ::operator<<((QDebug *)in_stack_fffffffffffff5b8.m_data,
                     (QWidget *)in_stack_fffffffffffff5b8.m_size);
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff558,
                           (char *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
        local_958 = (qsizetype)local_890;
        local_950 = local_888;
        s_00.m_data = (storage_type_conflict *)in_stack_fffffffffffff568;
        s_00.m_size = (qsizetype)in_stack_fffffffffffff560;
        QDebug::operator<<((QDebug *)in_stack_fffffffffffff558,s_00);
        QDebug::~QDebug(&local_920);
        QDebug::~QDebug(&local_928);
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x42a5f2);
  }
  QList<int>::~QList((QList<int> *)0x42a61d);
  QList<QCss::Declaration>::~QList((QList<QCss::Declaration> *)0x42a62a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::setProperties(QWidget *w)
{
    // The final occurrence of each property is authoritative.
    // Set value for each property in the order of property final occurrence
    // since properties interact.

    const QList<Declaration> decls = declarations(styleRules(w), QString());
    QList<int> finals; // indices in reverse order of each property's final occurrence

    {
        // scan decls for final occurrence of each "qproperty"
        QDuplicateTracker<QString> propertySet(decls.size());
        for (int i = decls.size() - 1; i >= 0; --i) {
            const QString property = decls.at(i).d->property;
            if (!property.startsWith("qproperty-"_L1, Qt::CaseInsensitive))
                continue;
            if (!propertySet.hasSeen(property))
                finals.append(i);
        }
    }

    for (int i = finals.size() - 1; i >= 0; --i) {
        const Declaration &decl = decls.at(finals[i]);
        QStringView property = decl.d->property;
        property = property.mid(10); // strip "qproperty-"
        const auto propertyL1 = property.toLatin1();

        const QMetaObject *metaObject = w->metaObject();
        int index = metaObject->indexOfProperty(propertyL1);
        if (Q_UNLIKELY(index == -1)) {
            qWarning() << w << " does not have a property named " << property;
            continue;
        }
        const QMetaProperty metaProperty = metaObject->property(index);
        if (Q_UNLIKELY(!metaProperty.isWritable() || !metaProperty.isDesignable())) {
            qWarning() << w << " cannot design property named " << property;
            continue;
        }

        QVariant v;
        const QVariant value = w->property(propertyL1);
        switch (value.userType()) {
        case QMetaType::QIcon: v = decl.iconValue(); break;
        case QMetaType::QImage: v = QImage(decl.uriValue()); break;
        case QMetaType::QPixmap: v = QPixmap(decl.uriValue()); break;
        case QMetaType::QRect: v = decl.rectValue(); break;
        case QMetaType::QSize: v = decl.sizeValue(); break;
        case QMetaType::QColor: v = decl.colorValue(); break;
        case QMetaType::QBrush: v = decl.brushValue(); break;
#ifndef QT_NO_SHORTCUT
        case QMetaType::QKeySequence: v = QKeySequence(decl.d->values.at(0).variant.toString()); break;
#endif
        default: v = decl.d->values.at(0).variant; break;
        }

        if (propertyL1 == QByteArrayView("styleSheet") && value == v)
            continue;

        w->setProperty(propertyL1, v);
    }
}